

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandExtWin(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  char *pcVar3;
  uint local_48;
  uint local_44;
  int fVerbose;
  int nDist;
  int nObjId;
  int c;
  Abc_Ntk_t *pNtk;
  Abc_Ntk_t *pNtkRes;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  fVerbose = -1;
  local_44 = 5;
  local_48 = 0;
  Extra_UtilGetoptReset();
  do {
    while( true ) {
      iVar1 = Extra_UtilGetopt(argc,argv,"NDvh");
      if (iVar1 == -1) {
        if (pAVar2 == (Abc_Ntk_t *)0x0) {
          Abc_Print(-1,"Empty network.\n");
          return 1;
        }
        iVar1 = Abc_NtkIsStrash(pAVar2);
        if (iVar1 == 0) {
          Abc_Print(-1,"Only works for structrally hashed networks.\n");
          return 1;
        }
        if (argc != globalUtilOptind) {
          Abc_Print(-1,"Not enough command-line arguments.\n");
          return 1;
        }
        pAVar2 = Abc_NtkDarExtWin(pAVar2,fVerbose,local_44,local_48);
        if (pAVar2 == (Abc_Ntk_t *)0x0) {
          Abc_Print(-1,"Extracting sequential window has failed.\n");
          return 0;
        }
        Abc_FrameReplaceCurrentNetwork(pAbc,pAVar2);
        return 0;
      }
      if (iVar1 == 0x44) break;
      if (iVar1 == 0x4e) {
        if (argc <= globalUtilOptind) {
          Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
          goto LAB_0028d0d8;
        }
        fVerbose = atoi(argv[globalUtilOptind]);
        globalUtilOptind = globalUtilOptind + 1;
        if (fVerbose < 1) goto LAB_0028d0d8;
      }
      else {
        if ((iVar1 == 0x68) || (iVar1 != 0x76)) goto LAB_0028d0d8;
        local_48 = local_48 ^ 1;
      }
    }
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-D\" should be followed by an integer.\n");
      break;
    }
    local_44 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = globalUtilOptind + 1;
  } while (0 < (int)local_44);
LAB_0028d0d8:
  Abc_Print(-2,"usage: extwin [-ND <num>] [-vh]\n");
  Abc_Print(-2,"\t         extracts sequential window from the AIG\n");
  Abc_Print(-2,"\t-N num : the ID of the object to use as the center [default = %d]\n",
            (ulong)(uint)fVerbose);
  Abc_Print(-2,"\t-D num : the \"radius\" of the window [default = %d]\n",(ulong)local_44);
  pcVar3 = "no";
  if (local_48 != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar3);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandExtWin( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtkRes, * pNtk;
    int c;
    int nObjId;
    int nDist;
    int fVerbose;

    extern Abc_Ntk_t * Abc_NtkDarExtWin( Abc_Ntk_t * pNtk, int nObjId, int nDist, int fVerbose );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    nObjId   = -1;
    nDist    =  5;
    fVerbose =  0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "NDvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nObjId = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nObjId <= 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer.\n" );
                goto usage;
            }
            nDist = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nDist <= 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Only works for structrally hashed networks.\n" );
        return 1;
    }

    if ( argc != globalUtilOptind )
    {
        Abc_Print( -1, "Not enough command-line arguments.\n" );
        return 1;
    }
    // modify the current network
    pNtkRes = Abc_NtkDarExtWin( pNtk, nObjId, nDist, fVerbose );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Extracting sequential window has failed.\n" );
        return 0;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: extwin [-ND <num>] [-vh]\n" );
    Abc_Print( -2, "\t         extracts sequential window from the AIG\n" );
    Abc_Print( -2, "\t-N num : the ID of the object to use as the center [default = %d]\n", nObjId );
    Abc_Print( -2, "\t-D num : the \"radius\" of the window [default = %d]\n", nDist );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}